

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err nni_http_set_redirect(nng_http *conn,nng_http_status status,char *reason,char *redirect)

{
  nng_err nVar1;
  size_t sVar2;
  char local_39;
  char *pcStack_38;
  _Bool static_value;
  char *loc;
  char *redirect_local;
  char *reason_local;
  nng_http_status status_local;
  nng_http *conn_local;
  
  local_39 = '\0';
  sVar2 = strlen(redirect);
  if (sVar2 < 200) {
    snprintf(conn->ubuf,200,"%s",redirect);
    pcStack_38 = conn->ubuf;
    local_39 = '\x01';
  }
  else {
    pcStack_38 = nni_strdup(redirect);
    if (pcStack_38 == (char *)0x0) {
      return NNG_ENOMEM;
    }
  }
  nni_http_del_header(conn,"Location");
  nni_list_node_remove(&(conn->location).node);
  nni_http_free_header(&conn->location);
  (conn->location).name = "Location";
  (conn->location).value = pcStack_38;
  (conn->location).field_0x20 = (conn->location).field_0x20 & 0xfe | 1;
  (conn->location).field_0x20 = (conn->location).field_0x20 & 0xfd | local_39 << 1;
  nni_list_prepend(&(conn->res).data.hdrs,&conn->location);
  nVar1 = http_conn_set_error(conn,status,reason,(char *)0x0,redirect);
  return nVar1;
}

Assistant:

nng_err
nni_http_set_redirect(nng_http *conn, nng_http_status status,
    const char *reason, const char *redirect)
{
	char *loc;
	bool  static_value = false;

	// The only users of this api, call do not use the URL buffer after
	// doing so, so we can optimize and use that for most redirections (no
	// more allocs!)
	if (strlen(redirect) < sizeof(conn->ubuf)) {
		snprintf(conn->ubuf, sizeof(conn->ubuf), "%s", redirect);
		loc          = conn->ubuf;
		static_value = true;
	} else if ((loc = nni_strdup(redirect)) == NULL) {
		return (NNG_ENOMEM);
	}
	(void) nni_http_del_header(conn, "Location");
	nni_list_node_remove(&conn->location.node);
	nni_http_free_header(&conn->location);
	conn->location.name         = "Location";
	conn->location.value        = loc;
	conn->location.static_name  = true;
	conn->location.static_value = static_value;
	nni_list_prepend(&conn->res.data.hdrs, &conn->location);
	return (http_conn_set_error(conn, status, reason, NULL, redirect));
}